

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.cpp
# Opt level: O0

int Rml::Math::ToPowerOfTwo(int number)

{
  int local_14;
  int i;
  int number_local;
  
  i = number;
  if ((number & number - 1U) != 0) {
    for (local_14 = 0x1f; -1 < local_14; local_14 = local_14 + -1) {
      if ((number & 1 << ((byte)local_14 & 0x1f)) != 0) {
        if (local_14 == 0x1f) {
          return -0x80000000;
        }
        return 1 << ((byte)local_14 + 1 & 0x1f);
      }
    }
    i = 0;
  }
  return i;
}

Assistant:

RMLUICORE_API int ToPowerOfTwo(int number)
	{
		// Check if the number is already a power of two.
		if ((number & (number - 1)) == 0)
			return number;

		// Assuming 31 useful bits in an int here ... !
		for (int i = 31; i >= 0; i--)
		{
			if (number & (1 << i))
			{
				if (i == 31)
					return 1 << 31;
				else
					return 1 << (i + 1);
			}
		}

		return 0;
	}